

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O3

void __thiscall TPZVec<float>::ReallocForNuma(TPZVec<float> *this)

{
  ulong uVar1;
  float *__src;
  float *__dest;
  
  uVar1 = this->fNElements;
  if ((uVar1 != 0) && (__src = this->fStore, __src != (float *)0x0)) {
    __dest = (float *)operator_new__(-(ulong)(uVar1 >> 0x3e != 0) | uVar1 << 2);
    memcpy(__dest,__src,uVar1 << 2);
    operator_delete__(__src);
    this->fStore = __dest;
  }
  return;
}

Assistant:

void ReallocForNuma() {
        if (fNElements == 0 || fStore == NULL)
            return;
        T* newStore = new T[fNElements];
        memcpy((void*)newStore,(void*)fStore,fNElements*sizeof(T));
        delete [] fStore;
        fStore = newStore;
	}